

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O2

bool __thiscall
boost::ext::ut::v1_1_8::
runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16>::run
          (runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16> *this,
          run_cfg rc)

{
  pointer pp_Var1;
  _func_void **suite;
  pointer pp_Var2;
  
  this->run_ = true;
  pp_Var1 = (this->suites_).super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (pp_Var2 = (this->suites_).super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl
                 .super__Vector_impl_data._M_start; pp_Var2 != pp_Var1; pp_Var2 = pp_Var2 + 1) {
    (**pp_Var2)();
  }
  pp_Var2 = (this->suites_).super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->suites_).super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_finish != pp_Var2) {
    (this->suites_).super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
    super__Vector_impl_data._M_finish = pp_Var2;
  }
  if ((rc.report_errors & 1U) != 0) {
    reporter<boost::ext::ut::v1_1_8::printer>::on(&this->reporter_);
  }
  return this->fails_ != 0;
}

Assistant:

[[nodiscard]] auto run(run_cfg rc = {}) -> bool {
      run_ = true;
      for (const auto& suite : suites_) {
        suite();
      }
      suites_.clear();

      if (rc.report_errors) {
        reporter_.on(events::summary{});
      }

      return fails_ > 0;
    }